

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O1

int __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectLeaveX(SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *feastol,int start,int incr)

{
  cpp_dec_float<100U,_int,_void> *this_00;
  uint *puVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  pointer pnVar3;
  pointer pnVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int iVar12;
  int iVar13;
  undefined8 *puVar14;
  pointer tol;
  long lVar15;
  long lVar16;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_254;
  cpp_dec_float<100U,_int,_void> local_228;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d0;
  cpp_dec_float<100U,_int,_void> local_1c8;
  cpp_dec_float<100U,_int,_void> local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined1 local_44;
  undefined8 local_40;
  
  local_228.fpclass = cpp_dec_float_finite;
  local_228.prec_elem = 0x10;
  local_228.data._M_elems[0] = 0;
  local_228.data._M_elems[1] = 0;
  local_228.data._M_elems[2] = 0;
  local_228.data._M_elems[3] = 0;
  local_228.data._M_elems[4] = 0;
  local_228.data._M_elems[5] = 0;
  local_228.data._M_elems[6] = 0;
  local_228.data._M_elems[7] = 0;
  local_228.data._M_elems[8] = 0;
  local_228.data._M_elems[9] = 0;
  local_228.data._M_elems[10] = 0;
  local_228.data._M_elems[0xb] = 0;
  local_228.data._M_elems[0xc] = 0;
  local_228.data._M_elems[0xd] = 0;
  local_228.data._M_elems._56_5_ = 0;
  local_228.data._M_elems[0xf]._1_3_ = 0;
  local_228.exp = 0;
  local_228.neg = false;
  pSVar2 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar3 = (pSVar2->theCoTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar4 = (pSVar2->coWeights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_178,0,(type *)0x0);
  pSVar2 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  iVar12 = (int)((long)(pSVar2->coWeights).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pSVar2->coWeights).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x33333333;
  local_254 = -1;
  if (start < iVar12) {
    local_1d0 = &this->last;
    lVar15 = (long)start;
    lVar16 = lVar15 * 0x50;
    local_254 = -1;
    do {
      local_1c8.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
      local_1c8.data._M_elems._8_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
      local_1c8.data._M_elems._16_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
      local_1c8.data._M_elems._24_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
      local_1c8.data._M_elems._32_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
      local_1c8.data._M_elems._40_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 10);
      local_1c8.data._M_elems._48_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 0xc);
      local_1c8.data._M_elems._56_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 0xe);
      local_1c8.exp = (feastol->m_backend).exp;
      local_1c8.neg = (feastol->m_backend).neg;
      local_1c8.fpclass = (feastol->m_backend).fpclass;
      local_1c8.prec_elem = (feastol->m_backend).prec_elem;
      if (local_1c8.data._M_elems[0] != 0 || local_1c8.fpclass != cpp_dec_float_finite) {
        local_1c8.neg = (bool)(local_1c8.neg ^ 1);
      }
      if ((local_1c8.fpclass != cpp_dec_float_NaN) &&
         (*(int *)((long)(&(pnVar3->m_backend).data + 1) + lVar16 + 8) != 2)) {
        this_00 = (cpp_dec_float<100U,_int,_void> *)
                  ((long)(pnVar3->m_backend).data._M_elems + lVar16);
        tol = pnVar3;
        iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (this_00,&local_1c8);
        if (iVar13 < 0) {
          local_88 = *(undefined8 *)(this_00->data)._M_elems;
          uStack_80 = *(undefined8 *)((this_00->data)._M_elems + 2);
          local_78 = *(undefined8 *)((this_00->data)._M_elems + 4);
          uStack_70 = *(undefined8 *)((this_00->data)._M_elems + 6);
          local_68 = *(undefined8 *)((this_00->data)._M_elems + 8);
          uStack_60 = *(undefined8 *)((this_00->data)._M_elems + 10);
          local_58 = *(undefined8 *)((this_00->data)._M_elems + 0xc);
          uStack_50 = *(undefined8 *)((this_00->data)._M_elems + 0xe);
          local_48 = *(undefined4 *)((long)(&(pnVar3->m_backend).data + 1) + lVar16);
          local_44 = *(undefined1 *)((long)(&(pnVar3->m_backend).data + 1) + lVar16 + 4);
          local_40 = *(undefined8 *)((long)(&(pnVar3->m_backend).data + 1) + lVar16 + 8);
          puVar1 = (uint *)((long)&(pnVar4->m_backend).data + lVar16);
          local_d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
          local_d8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
          puVar1 = (uint *)((long)&(pnVar4->m_backend).data + lVar16 + 0x10);
          local_d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
          local_d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
          puVar1 = (uint *)((long)&(pnVar4->m_backend).data + lVar16 + 0x20);
          local_d8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
          local_d8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
          puVar1 = (uint *)((long)&(pnVar4->m_backend).data + lVar16 + 0x30);
          local_d8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
          local_d8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
          local_d8.m_backend.exp = *(int *)((long)&(pnVar4->m_backend).data + lVar16 + 0x40);
          local_d8.m_backend.neg = *(bool *)((long)&(pnVar4->m_backend).data + lVar16 + 0x44);
          local_d8.m_backend._72_8_ =
               *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar16 + 0x48);
          local_128.m_backend.data._M_elems._0_8_ =
               *(undefined8 *)(feastol->m_backend).data._M_elems;
          local_128.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
          local_128.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
          local_128.m_backend.data._M_elems._24_8_ =
               *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
          local_128.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
          local_128.m_backend.data._M_elems._40_8_ =
               *(undefined8 *)((feastol->m_backend).data._M_elems + 10);
          local_128.m_backend.data._M_elems._48_8_ =
               *(undefined8 *)((feastol->m_backend).data._M_elems + 0xc);
          local_128.m_backend.data._M_elems._56_8_ =
               *(undefined8 *)((feastol->m_backend).data._M_elems + 0xe);
          local_128.m_backend.exp = (feastol->m_backend).exp;
          local_128.m_backend.neg = (feastol->m_backend).neg;
          local_128.m_backend.fpclass = (feastol->m_backend).fpclass;
          local_128.m_backend.prec_elem = (feastol->m_backend).prec_elem;
          devexpr::
          computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_1c8,(devexpr *)&local_88,&local_d8,&local_128,tol);
          local_228.data._M_elems[0xc] = local_1c8.data._M_elems[0xc];
          local_228.data._M_elems[0xd] = local_1c8.data._M_elems[0xd];
          local_228.data._M_elems._56_5_ = local_1c8.data._M_elems._56_5_;
          local_228.data._M_elems[0xf]._1_3_ = local_1c8.data._M_elems[0xf]._1_3_;
          local_228.data._M_elems[8] = local_1c8.data._M_elems[8];
          local_228.data._M_elems[9] = local_1c8.data._M_elems[9];
          local_228.data._M_elems[10] = local_1c8.data._M_elems[10];
          local_228.data._M_elems[0xb] = local_1c8.data._M_elems[0xb];
          local_228.data._M_elems[4] = local_1c8.data._M_elems[4];
          local_228.data._M_elems[5] = local_1c8.data._M_elems[5];
          local_228.data._M_elems[6] = local_1c8.data._M_elems[6];
          local_228.data._M_elems[7] = local_1c8.data._M_elems[7];
          local_228.data._M_elems[0] = local_1c8.data._M_elems[0];
          local_228.data._M_elems[1] = local_1c8.data._M_elems[1];
          local_228.data._M_elems[2] = local_1c8.data._M_elems[2];
          local_228.data._M_elems[3] = local_1c8.data._M_elems[3];
          local_228.exp = local_1c8.exp;
          local_228.neg = local_1c8.neg;
          local_228.fpclass = local_1c8.fpclass;
          local_228.prec_elem = local_1c8.prec_elem;
          if (((local_1c8.fpclass != cpp_dec_float_NaN) && (local_178.fpclass != cpp_dec_float_NaN))
             && (iVar13 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                    (&local_228,&local_178), 0 < iVar13)) {
            puVar14 = (undefined8 *)((long)&(pnVar4->m_backend).data + lVar16 + 0x48);
            local_178.data._M_elems[0xf]._1_3_ = local_228.data._M_elems[0xf]._1_3_;
            local_178.data._M_elems._56_5_ = local_228.data._M_elems._56_5_;
            local_178.data._M_elems[0xc] = local_228.data._M_elems[0xc];
            local_178.data._M_elems[0xd] = local_228.data._M_elems[0xd];
            local_178.data._M_elems[8] = local_228.data._M_elems[8];
            local_178.data._M_elems[9] = local_228.data._M_elems[9];
            local_178.data._M_elems[10] = local_228.data._M_elems[10];
            local_178.data._M_elems[0xb] = local_228.data._M_elems[0xb];
            local_178.data._M_elems[4] = local_228.data._M_elems[4];
            local_178.data._M_elems[5] = local_228.data._M_elems[5];
            local_178.data._M_elems[6] = local_228.data._M_elems[6];
            local_178.data._M_elems[7] = local_228.data._M_elems[7];
            local_178.data._M_elems[0] = local_228.data._M_elems[0];
            local_178.data._M_elems[1] = local_228.data._M_elems[1];
            local_178.data._M_elems[2] = local_228.data._M_elems[2];
            local_178.data._M_elems[3] = local_228.data._M_elems[3];
            local_178.exp = local_228.exp;
            local_178.neg = local_228.neg;
            local_178.fpclass = local_228.fpclass;
            local_178.prec_elem = local_228.prec_elem;
            uVar5 = puVar14[-9];
            uVar6 = puVar14[-8];
            uVar7 = puVar14[-7];
            uVar8 = puVar14[-6];
            uVar9 = puVar14[-5];
            uVar10 = puVar14[-4];
            uVar11 = puVar14[-2];
            *(undefined8 *)((local_1d0->m_backend).data._M_elems + 0xc) = puVar14[-3];
            *(undefined8 *)((local_1d0->m_backend).data._M_elems + 0xe) = uVar11;
            *(undefined8 *)((local_1d0->m_backend).data._M_elems + 8) = uVar9;
            *(undefined8 *)((local_1d0->m_backend).data._M_elems + 10) = uVar10;
            *(undefined8 *)((local_1d0->m_backend).data._M_elems + 4) = uVar7;
            *(undefined8 *)((local_1d0->m_backend).data._M_elems + 6) = uVar8;
            *(undefined8 *)(local_1d0->m_backend).data._M_elems = uVar5;
            *(undefined8 *)((local_1d0->m_backend).data._M_elems + 2) = uVar6;
            (this->last).m_backend.exp = *(int *)(puVar14 + -1);
            (this->last).m_backend.neg = *(bool *)((long)puVar14 + -4);
            uVar5 = *puVar14;
            (this->last).m_backend.fpclass = (int)uVar5;
            (this->last).m_backend.prec_elem = (int)((ulong)uVar5 >> 0x20);
            local_254 = (int)lVar15;
          }
        }
      }
      lVar15 = lVar15 + incr;
      lVar16 = lVar16 + (long)incr * 0x50;
    } while (lVar15 < iVar12);
  }
  return local_254;
}

Assistant:

int SPxDevexPR<R>::selectLeaveX(R feastol, int start, int incr)
{
   R x;

   const R* fTest = this->thesolver->fTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   R best = 0;
   int bstI = -1;
   int end = this->thesolver->coWeights.dim();

   for(; start < end; start += incr)
   {
      if(fTest[start] < -feastol)
      {
         x = devexpr::computePrice(fTest[start], cpen[start], feastol);

         if(x > best)
         {
            best = x;
            bstI = start;
            last = cpen[start];
         }
      }
   }

   return bstI;
}